

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_unset_compression_param(fitsfile *fptr,int *status)

{
  int ii;
  int *status_local;
  fitsfile *fptr_local;
  
  fptr->Fptr->compress_type = 0;
  fptr->Fptr->quantize_level = 0.0;
  fptr->Fptr->quantize_method = 0;
  fptr->Fptr->dither_seed = 0;
  fptr->Fptr->hcomp_scale = 0.0;
  for (ii = 0; ii < 6; ii = ii + 1) {
    fptr->Fptr->tilesize[ii] = 0;
  }
  return *status;
}

Assistant:

int fits_unset_compression_param(
      fitsfile *fptr,
      int *status) 
{
    int ii;

    (fptr->Fptr)->compress_type = 0;
    (fptr->Fptr)->quantize_level = 0;
    (fptr->Fptr)->quantize_method = 0;
    (fptr->Fptr)->dither_seed = 0; 
    (fptr->Fptr)->hcomp_scale = 0;

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        (fptr->Fptr)->tilesize[ii] = 0;
    }

    return(*status);
}